

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall sglr::GLContext::genBuffers(GLContext *this,int numBuffers,deUint32 *buffers)

{
  deUint32 *buffers_local;
  int numBuffers_local;
  GLContext *this_local;
  
  glu::CallLogWrapper::glGenBuffers(this->m_wrapper,numBuffers,buffers);
  if (0 < numBuffers) {
    std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
    insert<unsigned_int*>
              ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
               &this->m_allocatedBuffers,buffers,buffers + numBuffers);
  }
  return;
}

Assistant:

void GLContext::genBuffers (int numBuffers, deUint32* buffers)
{
	m_wrapper->glGenBuffers(numBuffers, buffers);
	if (numBuffers > 0)
		m_allocatedBuffers.insert(buffers, buffers+numBuffers);
}